

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

ini_section * __thiscall xray_re::xr_ini_file::r_section(xr_ini_file *this,char *sname)

{
  bool bVar1;
  int iVar2;
  char *s1;
  reference ppiVar3;
  bool bVar4;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_40;
  ini_section_pred local_38;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_30;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_28;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_20;
  ini_section_vec_cit it;
  char *sname_local;
  xr_ini_file *this_local;
  
  it._M_current = (ini_section **)sname;
  local_28._M_current =
       (ini_section **)
       std::
       vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       ::begin(&this->m_sections);
  local_30._M_current =
       (ini_section **)
       std::
       vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       ::end(&this->m_sections);
  ini_section_pred::ini_section_pred(&local_38,(char *)it._M_current);
  local_20 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section*const*,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                       (local_28,local_30,local_38);
  local_40._M_current =
       (ini_section **)
       std::
       vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       ::end(&this->m_sections);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_40);
  bVar4 = true;
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
    ::operator*(&local_20);
    s1 = (char *)std::__cxx11::string::c_str();
    iVar2 = xr_stricmp(s1,(char *)it._M_current);
    bVar4 = iVar2 != 0;
  }
  if (!bVar4) {
    ppiVar3 = __gnu_cxx::
              __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
              ::operator*(&local_20);
    return *ppiVar3;
  }
  msg("can\'t find section %s",it._M_current);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                ,0x35,
                "const xr_ini_file::ini_section *xray_re::xr_ini_file::r_section(const char *) const"
               );
}

Assistant:

const xr_ini_file::ini_section* xr_ini_file::r_section(const char* sname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), sname) != 0) {
		msg("can't find section %s", sname);
		xr_not_expected();
	}
	return *it;
}